

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::
make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::operator()
          (make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *this,stringstream *msg,char *arg,duration<long,_std::ratio<1L,_1000000000L>_> args)

{
  std::operator<<((ostream *)(msg + 0x10),arg);
  std::ostream::_M_insert<long>((long)(msg + 0x10));
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }